

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O0

int __thiscall
CVmObjTimeZone::getp_getRules(CVmObjTimeZone *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int iVar2;
  vm_obj_id_t obj;
  int *in_RCX;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  uint argc;
  CVmTimeZone *in_stack_00000090;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int n;
  
  if (in_RCX == (int *)0x0) {
    n = 0;
  }
  else {
    n = *in_RCX;
  }
  iVar2 = n;
  if ((getp_getRules(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getRules(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getRules::desc,0);
    __cxa_guard_release(&getp_getRules(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_RDI,(uint *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (iVar2 == 0) {
    get_tz((CVmObjTimeZone *)0x34adf0);
    obj = CVmTimeZone::get_rule_list(in_stack_00000090);
    vm_val_t::set_obj(in_RDX,obj);
    CVmStack::discard(n);
  }
  return 1;
}

Assistant:

int CVmObjTimeZone::getp_getRules(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the rule list */
    retval->set_obj(get_tz()->get_rule_list(vmg0_));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}